

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O2

pboolean p_socket_shutdown(PSocket *socket,pboolean shutdown_read,pboolean shutdown_write,
                          PError **error)

{
  pboolean pVar1;
  int iVar2;
  pint pVar3;
  PErrorIO code;
  char *message;
  uint __how;
  
  if (socket == (PSocket *)0x0) {
    message = "Invalid input argument";
    code = P_ERROR_IO_INVALID_ARGUMENT;
    pVar3 = 0;
LAB_00113090:
    pVar1 = 0;
    p_error_set_error_p(error,code,pVar3,message);
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 == 0) {
      return 0;
    }
    if (shutdown_write != 0 || shutdown_read != 0) {
      __how = 2;
      if (shutdown_write != 1 || shutdown_read != 1) {
        __how = (uint)(shutdown_read != 1);
      }
      iVar2 = shutdown(socket->fd,__how);
      if (iVar2 != 0) {
        pVar3 = p_error_get_last_net();
        code = p_error_get_io_from_system(pVar3);
        pVar3 = p_error_get_last_net();
        message = "Failed to call shutdown() on socket";
        goto LAB_00113090;
      }
      if (shutdown_write == 1 && shutdown_read == 1) {
        socket->field_0x18 = socket->field_0x18 & 0xf7;
      }
    }
    pVar1 = 1;
  }
  return pVar1;
}

Assistant:

P_LIB_API pboolean
p_socket_shutdown (PSocket	*socket,
		   pboolean	shutdown_read,
		   pboolean	shutdown_write,
		   PError	**error)
{
	pint how;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	if (P_UNLIKELY (shutdown_read == FALSE && shutdown_write == FALSE))
		return TRUE;

#ifndef P_OS_WIN
	if (shutdown_read == TRUE && shutdown_write == TRUE)
		how = SHUT_RDWR;
	else if (shutdown_read == TRUE)
		how = SHUT_RD;
	else
		how = SHUT_WR;
#else
	if (shutdown_read == TRUE && shutdown_write == TRUE)
		how = SD_BOTH;
	else if (shutdown_read == TRUE)
		how = SD_RECEIVE;
	else
		how = SD_SEND;
#endif

	if (P_UNLIKELY (shutdown (socket->fd, how) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call shutdown() on socket");
		return FALSE;
	}

	if (shutdown_read == TRUE && shutdown_write == TRUE)
		socket->connected = FALSE;

	return TRUE;
}